

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshEdit.cpp
# Opt level: O3

void __thiscall CMU462::HalfedgeMesh::splitPolygon(HalfedgeMesh *this,FaceIter f)

{
  size_type __n;
  size_t *psVar1;
  undefined1 auVar2 [16];
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  _List_node_base *p_Var6;
  iterator iVar7;
  ulong uVar8;
  _List_node_base *p_Var9;
  _Node *p_Var10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  pointer p_Var14;
  ulong uVar15;
  ulong uVar16;
  _List_iterator<CMU462::Halfedge> *hi;
  _List_iterator<CMU462::Halfedge> *p_Var17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  _List_node_base _Var21;
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  h_new_twin_vec;
  vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
  f_new_vec;
  vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
  e_new_vec;
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  h_new_vec;
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  h_outer_vec;
  vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
  v_outer_vec;
  HalfedgeIter h;
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  local_188;
  vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
  local_168;
  vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
  local_148;
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  local_128;
  ulong local_110;
  _List_iterator<CMU462::Halfedge> *local_108;
  iterator iStack_100;
  _List_iterator<CMU462::Halfedge> *local_f8;
  vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
  local_e8;
  _List_iterator<CMU462::Halfedge> local_d0;
  _List_iterator<CMU462::Face> local_c8;
  Face local_c0;
  
  local_d0._M_node = f._M_node[9]._M_next;
  lVar11 = 3;
  p_Var9 = local_d0._M_node;
  do {
    p_Var9 = p_Var9[1]._M_prev;
    lVar11 = lVar11 + -1;
  } while (local_d0._M_node != p_Var9);
  if (lVar11 == 0) {
    return;
  }
  local_108 = (_List_iterator<CMU462::Halfedge> *)0x0;
  iStack_100._M_current = (_List_iterator<CMU462::Halfedge> *)0x0;
  local_f8 = (_List_iterator<CMU462::Halfedge> *)0x0;
  uVar13 = 0;
  do {
    uVar12 = uVar13;
    if (iStack_100._M_current == local_f8) {
      std::
      vector<std::_List_iterator<CMU462::Halfedge>,std::allocator<std::_List_iterator<CMU462::Halfedge>>>
      ::_M_realloc_insert<std::_List_iterator<CMU462::Halfedge>const&>
                ((vector<std::_List_iterator<CMU462::Halfedge>,std::allocator<std::_List_iterator<CMU462::Halfedge>>>
                  *)&local_108,iStack_100,&local_d0);
    }
    else {
      (iStack_100._M_current)->_M_node = local_d0._M_node;
      iStack_100._M_current = iStack_100._M_current + 1;
    }
    local_d0._M_node = local_d0._M_node[1]._M_prev;
    uVar13 = uVar12 + 1;
  } while (f._M_node[9]._M_next != local_d0._M_node);
  local_e8.
  super__Vector_base<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.
  super__Vector_base<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.
  super__Vector_base<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (_List_iterator<CMU462::Vertex> *)0x0;
  std::
  vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
  ::reserve(&local_e8,uVar13);
  iVar7._M_current = (_List_iterator<CMU462::Halfedge> *)iStack_100;
  if (local_108 != iStack_100._M_current) {
    p_Var17 = local_108;
    do {
      if (local_e8.
          super__Vector_base<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_e8.
          super__Vector_base<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<std::_List_iterator<CMU462::Vertex>,std::allocator<std::_List_iterator<CMU462::Vertex>>>
        ::_M_realloc_insert<std::_List_iterator<CMU462::Vertex>const&>
                  ((vector<std::_List_iterator<CMU462::Vertex>,std::allocator<std::_List_iterator<CMU462::Vertex>>>
                    *)&local_e8,
                   (iterator)
                   local_e8.
                   super__Vector_base<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                   (_List_iterator<CMU462::Vertex> *)(p_Var17->_M_node + 2));
      }
      else {
        (local_e8.
         super__Vector_base<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
         ._M_impl.super__Vector_impl_data._M_finish)->_M_node = p_Var17->_M_node[2]._M_next;
        local_e8.
        super__Vector_base<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_e8.
             super__Vector_base<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      p_Var17 = p_Var17 + 1;
    } while (p_Var17 != iVar7._M_current);
  }
  local_128.
  super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.
  super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128.
  super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (_List_iterator<CMU462::Halfedge> *)0x0;
  local_188.
  super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (_List_iterator<CMU462::Halfedge> *)0x0;
  local_188.
  super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_188.
  super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __n = uVar12 - 2;
  std::
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  ::reserve(&local_128,__n);
  std::
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  ::reserve(&local_188,__n);
  local_148.
  super__Vector_base<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.
  super__Vector_base<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148.
  super__Vector_base<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (_List_iterator<CMU462::Edge> *)0x0;
  std::
  vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>::
  reserve(&local_148,__n);
  local_168.
  super__Vector_base<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_168.
  super__Vector_base<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168.
  super__Vector_base<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (_List_iterator<CMU462::Face> *)0x0;
  std::
  vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>::
  reserve(&local_168,__n);
  if (uVar13 == 3) {
  }
  else {
    uVar19 = uVar12 - 2;
    local_110 = uVar19;
    do {
      p_Var9 = (_List_node_base *)operator_new(0x38);
      p_Var9[2]._M_next = (_List_node_base *)0x0;
      p_Var9[2]._M_prev = (_List_node_base *)0x0;
      p_Var9[1]._M_next = (_List_node_base *)0x0;
      p_Var9[1]._M_prev = (_List_node_base *)0x0;
      p_Var9[3]._M_next = (_List_node_base *)0x0;
      std::__detail::_List_node_base::_M_hook(p_Var9);
      psVar1 = &(this->halfedges).
                super__List_base<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>._M_impl.
                _M_node._M_size;
      *psVar1 = *psVar1 + 1;
      local_c0.quadric.entries[0].x = (double)p_Var9;
      if (local_128.
          super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_128.
          super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<std::_List_iterator<CMU462::Halfedge>,std::allocator<std::_List_iterator<CMU462::Halfedge>>>
        ::_M_realloc_insert<std::_List_iterator<CMU462::Halfedge>>
                  ((vector<std::_List_iterator<CMU462::Halfedge>,std::allocator<std::_List_iterator<CMU462::Halfedge>>>
                    *)&local_128,
                   (iterator)
                   local_128.
                   super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                   (_List_iterator<CMU462::Halfedge> *)&local_c0);
      }
      else {
        (local_128.
         super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
         ._M_impl.super__Vector_impl_data._M_finish)->_M_node = p_Var9;
        local_128.
        super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_128.
             super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      p_Var9 = (_List_node_base *)operator_new(0x38);
      p_Var9[2]._M_next = (_List_node_base *)0x0;
      p_Var9[2]._M_prev = (_List_node_base *)0x0;
      p_Var9[1]._M_next = (_List_node_base *)0x0;
      p_Var9[1]._M_prev = (_List_node_base *)0x0;
      p_Var9[3]._M_next = (_List_node_base *)0x0;
      std::__detail::_List_node_base::_M_hook(p_Var9);
      psVar1 = &(this->halfedges).
                super__List_base<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>._M_impl.
                _M_node._M_size;
      *psVar1 = *psVar1 + 1;
      local_c0.quadric.entries[0].x = (double)p_Var9;
      if (local_188.
          super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_188.
          super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<std::_List_iterator<CMU462::Halfedge>,std::allocator<std::_List_iterator<CMU462::Halfedge>>>
        ::_M_realloc_insert<std::_List_iterator<CMU462::Halfedge>>
                  ((vector<std::_List_iterator<CMU462::Halfedge>,std::allocator<std::_List_iterator<CMU462::Halfedge>>>
                    *)&local_188,
                   (iterator)
                   local_188.
                   super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                   (_List_iterator<CMU462::Halfedge> *)&local_c0);
      }
      else {
        (local_188.
         super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
         ._M_impl.super__Vector_impl_data._M_finish)->_M_node = p_Var9;
        local_188.
        super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_188.
             super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      p_Var9 = (_List_node_base *)operator_new(0x60);
      *(undefined1 (*) [16])((long)&p_Var9[1]._M_prev + 1) = (undefined1  [16])0x0;
      p_Var9[1]._M_next = (_List_node_base *)0x0;
      p_Var9[1]._M_prev = (_List_node_base *)0x0;
      p_Var9[3]._M_next = (_List_node_base *)0x0;
      p_Var9[3]._M_prev = (_List_node_base *)0x0;
      p_Var9[4]._M_next = (_List_node_base *)0x0;
      p_Var9[4]._M_prev = (_List_node_base *)0x0;
      p_Var9[5]._M_next = (_List_node_base *)0x0;
      p_Var9[5]._M_prev = (_List_node_base *)0x0;
      std::__detail::_List_node_base::_M_hook(p_Var9);
      psVar1 = &(this->edges).super__List_base<CMU462::Edge,_std::allocator<CMU462::Edge>_>._M_impl.
                _M_node._M_size;
      *psVar1 = *psVar1 + 1;
      local_c0.quadric.entries[0].x = (double)p_Var9;
      if (local_148.
          super__Vector_base<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_148.
          super__Vector_base<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<std::_List_iterator<CMU462::Edge>,std::allocator<std::_List_iterator<CMU462::Edge>>>
        ::_M_realloc_insert<std::_List_iterator<CMU462::Edge>>
                  ((vector<std::_List_iterator<CMU462::Edge>,std::allocator<std::_List_iterator<CMU462::Edge>>>
                    *)&local_148,
                   (iterator)
                   local_148.
                   super__Vector_base<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                   (_List_iterator<CMU462::Edge> *)&local_c0);
      }
      else {
        (local_148.
         super__Vector_base<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
         ._M_impl.super__Vector_impl_data._M_finish)->_M_node = p_Var9;
        local_148.
        super__Vector_base<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_148.
             super__Vector_base<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      memset(&local_c0,0,0x89);
      p_Var10 = std::__cxx11::list<CMU462::Face,_std::allocator<CMU462::Face>_>::
                _M_create_node<CMU462::Face>(&this->faces,&local_c0);
      std::__detail::_List_node_base::_M_hook(&p_Var10->super__List_node_base);
      psVar1 = &(this->faces).super__List_base<CMU462::Face,_std::allocator<CMU462::Face>_>._M_impl.
                _M_node._M_size;
      *psVar1 = *psVar1 + 1;
      local_c8._M_node = &p_Var10->super__List_node_base;
      if (local_168.
          super__Vector_base<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_168.
          super__Vector_base<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<std::_List_iterator<CMU462::Face>,std::allocator<std::_List_iterator<CMU462::Face>>>
        ::_M_realloc_insert<std::_List_iterator<CMU462::Face>>
                  ((vector<std::_List_iterator<CMU462::Face>,std::allocator<std::_List_iterator<CMU462::Face>>>
                    *)&local_168,
                   (iterator)
                   local_168.
                   super__Vector_base<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,&local_c8);
      }
      else {
        (local_168.
         super__Vector_base<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
         ._M_impl.super__Vector_impl_data._M_finish)->_M_node = &p_Var10->super__List_node_base;
        local_168.
        super__Vector_base<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_168.
             super__Vector_base<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      uVar19 = uVar19 - 1;
    } while (uVar19 != 0);
    if (uVar13 != 3) {
      uVar19 = 0;
      do {
        local_148.
        super__Vector_base<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar19]._M_node[5]._M_prev =
             local_128.
             super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar19]._M_node;
        local_168.
        super__Vector_base<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar19]._M_node[9]._M_next =
             local_188.
             super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar19]._M_node;
        uVar19 = uVar19 + 1;
      } while (local_110 != uVar19);
    }
  }
  p_Var9 = (local_128.
            super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
            ._M_impl.super__Vector_impl_data._M_start)->_M_node;
  p_Var3 = (local_188.
            super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
            ._M_impl.super__Vector_impl_data._M_start)->_M_node;
  p_Var4 = local_e8.
           super__Vector_base<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
           ._M_impl.super__Vector_impl_data._M_start[2]._M_node;
  p_Var5 = (local_148.
            super__Vector_base<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
            ._M_impl.super__Vector_impl_data._M_start)->_M_node;
  p_Var9[1]._M_prev = local_108->_M_node;
  p_Var9[1]._M_next = p_Var3;
  p_Var9[2]._M_next = p_Var4;
  p_Var9[2]._M_prev = p_Var5;
  p_Var9[3]._M_next = f._M_node;
  local_108[1]._M_node[1]._M_prev =
       (local_128.
        super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
        ._M_impl.super__Vector_impl_data._M_start)->_M_node;
  if (uVar13 == 4) {
    uVar19 = 3;
    uVar13 = 2;
    uVar15 = 0;
  }
  else {
    uVar18 = 0;
    uVar16 = 0;
    uVar8 = 2;
    uVar19 = uVar12;
    do {
      uVar20 = uVar19;
      uVar15 = uVar8;
      p_Var9 = local_168.
               super__Vector_base<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar18]._M_node;
      if ((uVar18 & 1) == 0) {
        p_Var3 = local_188.
                 super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar18]._M_node;
        p_Var4 = local_e8.
                 super__Vector_base<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar16]._M_node;
        p_Var5 = local_148.
                 super__Vector_base<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar18]._M_node;
        p_Var6 = (local_128.
                  super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar18)[1]._M_node;
        p_Var3[1]._M_next =
             local_128.
             super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar18]._M_node;
        p_Var3[1]._M_prev = p_Var6;
        p_Var3[2]._M_next = p_Var4;
        p_Var3[2]._M_prev = p_Var5;
        p_Var3[3]._M_next = p_Var9;
        p_Var9 = local_128.
                 super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar18 + 1]._M_node;
        p_Var3 = local_188.
                 super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar18 + 1]._M_node;
        p_Var4 = local_e8.
                 super__Vector_base<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar15]._M_node;
        p_Var5 = local_148.
                 super__Vector_base<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar18 + 1]._M_node;
        p_Var6 = local_168.
                 super__Vector_base<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar18]._M_node;
        p_Var9[1]._M_prev = local_108[uVar20]._M_node;
        p_Var9[1]._M_next = p_Var3;
        p_Var9[2]._M_next = p_Var4;
        p_Var9[2]._M_prev = p_Var5;
        p_Var9[3]._M_next = p_Var6;
        local_108[uVar20]._M_node[1]._M_prev =
             local_188.
             super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar18]._M_node;
        local_108[uVar20]._M_node[3]._M_next =
             local_168.
             super__Vector_base<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar18]._M_node;
        uVar18 = uVar18 | 1;
        uVar19 = uVar15 + 1;
      }
      else {
        p_Var3 = local_128.
                 super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar18 + 1]._M_node;
        p_Var4 = local_e8.
                 super__Vector_base<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar20]._M_node;
        p_Var5 = local_148.
                 super__Vector_base<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar18 + 1]._M_node;
        auVar2 = *(undefined1 (*) [16])
                  (local_188.
                   super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar18);
        _Var21._M_next = auVar2._8_8_;
        _Var21._M_prev._0_4_ = auVar2._0_4_;
        _Var21._M_prev._4_4_ = auVar2._4_4_;
        p_Var3[1] = _Var21;
        p_Var3[2]._M_next = p_Var4;
        p_Var3[2]._M_prev = p_Var5;
        p_Var3[3]._M_next = p_Var9;
        p_Var9 = local_188.
                 super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar18]._M_node;
        p_Var3 = local_128.
                 super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar18]._M_node;
        p_Var4 = local_e8.
                 super__Vector_base<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar15]._M_node;
        p_Var5 = local_148.
                 super__Vector_base<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar18]._M_node;
        p_Var6 = local_168.
                 super__Vector_base<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar18]._M_node;
        p_Var9[1]._M_prev = local_108[uVar16]._M_node;
        p_Var9[1]._M_next = p_Var3;
        p_Var9[2]._M_next = p_Var4;
        p_Var9[2]._M_prev = p_Var5;
        p_Var9[3]._M_next = p_Var6;
        local_108[uVar16]._M_node[1]._M_prev =
             local_128.
             super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar18 + 1]._M_node;
        local_108[uVar16]._M_node[3]._M_next =
             local_168.
             super__Vector_base<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar18]._M_node;
        uVar18 = uVar18 + 1;
        uVar19 = uVar15 - 1;
      }
      uVar16 = uVar15;
      uVar8 = uVar20;
    } while (uVar18 + 4 != uVar13);
    uVar13 = uVar20;
    local_110 = uVar12;
    if ((uVar12 & 1) == 0) {
      uVar13 = uVar15;
      uVar15 = uVar20;
    }
  }
  p_Var9 = local_188.
           super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1]._M_node;
  p_Var3 = local_128.
           super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1]._M_node;
  p_Var4 = local_e8.
           super__Vector_base<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar15]._M_node;
  p_Var5 = local_148.
           super__Vector_base<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1]._M_node;
  p_Var6 = local_168.
           super__Vector_base<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1]._M_node;
  p_Var9[1]._M_prev = local_108[uVar13]._M_node;
  p_Var9[1]._M_next = p_Var3;
  p_Var9[2]._M_next = p_Var4;
  p_Var9[2]._M_prev = p_Var5;
  p_Var9[3]._M_next = p_Var6;
  p_Var9 = local_168.
           super__Vector_base<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1]._M_node;
  local_108[uVar13]._M_node[3]._M_next = p_Var9;
  local_108[uVar19]._M_node[3]._M_next = p_Var9;
  local_108[uVar19]._M_node[1]._M_prev =
       local_188.
       super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
       ._M_impl.super__Vector_impl_data._M_finish[-1]._M_node;
  p_Var14 = local_148.
            super__Vector_base<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (local_168.
      super__Vector_base<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_168.
                    super__Vector_base<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_168.
                          super__Vector_base<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_168.
                          super__Vector_base<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    p_Var14 = local_148.
              super__Vector_base<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (local_148.
        super__Vector_base<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
        ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) goto LAB_0010e27e;
  }
  operator_delete(p_Var14,(long)local_148.
                                super__Vector_base<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)p_Var14);
LAB_0010e27e:
  if (local_188.
      super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_188.
                    super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_188.
                          super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_188.
                          super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_128.
      super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_128.
                    super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_128.
                          super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_128.
                          super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_e8.
      super__Vector_base<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.
                    super__Vector_base<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_e8.
                          super__Vector_base<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.
                          super__Vector_base<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_108 != (_List_iterator<CMU462::Halfedge> *)0x0) {
    operator_delete(local_108,(long)local_f8 - (long)local_108);
  }
  return;
}

Assistant:

void HalfedgeMesh::splitPolygon(FaceIter f) {
  // Triangulate a polygonal face

  // If already triangle, return
  if (f->degree() == 3) {
    return;
  }

  // Collect
  // HalfEdges
  auto h = f->halfedge();
  size_t degree = 0;
  vector<HalfedgeIter> h_outer_vec;
  do {
    ++degree;
    h_outer_vec.push_back(h);
    h = h->next();
  } while (h != f->halfedge());

  // Vertices
  vector<VertexIter> v_outer_vec;
  v_outer_vec.reserve(degree);
  for (const auto& hi : h_outer_vec) {
    v_outer_vec.push_back(hi->vertex());
  }

  // Allocate
  // HalfEdges
  vector<HalfedgeIter> h_new_vec, h_new_twin_vec;
  h_new_vec.reserve(degree - 3);
  h_new_twin_vec.reserve(degree - 3);

  // Edges
  vector<EdgeIter> e_new_vec;
  e_new_vec.reserve(degree - 3);

  // Faces
  vector<FaceIter> f_new_vec;
  f_new_vec.reserve(degree - 3);

  for (size_t i = 0; i < degree - 3; ++i) {
    h_new_vec.push_back(newHalfedge());
    h_new_twin_vec.push_back(newHalfedge());

    e_new_vec.push_back(newEdge());

    f_new_vec.push_back(newFace());
  }

  // Reassign
  // New edges and faces
  for (size_t i = 0; i < degree - 3; ++i) {
    e_new_vec[i]->halfedge() = h_new_vec[i];
    f_new_vec[i]->halfedge() = h_new_twin_vec[i];
  }

  // Halfedges of the first face
  h_new_vec[0]->setNeighbors(h_outer_vec[0],
                             h_new_twin_vec[0],
                             v_outer_vec[2],
                             e_new_vec[0],
                             f);
  h_outer_vec[1]->next() = h_new_vec[0];

  // Halfedges of the middle faces
  size_t first_v = 0, second_v = 2, third_v = degree - 1, t;
  for (size_t i = 0; i < degree - 4; ++i) {
    if (i % 2 == 0) {
      h_new_twin_vec[i]->setNeighbors(h_new_vec[i + 1],
                                      h_new_vec[i],
                                      v_outer_vec[first_v],
                                      e_new_vec[i],
                                      f_new_vec[i]);
      h_new_vec[i + 1]->setNeighbors(h_outer_vec[third_v],
                                     h_new_twin_vec[i + 1],
                                     v_outer_vec[second_v],
                                     e_new_vec[i + 1],
                                     f_new_vec[i]);
      h_outer_vec[third_v]->next() = h_new_twin_vec[i];
      h_outer_vec[third_v]->face() = f_new_vec[i];
      t = second_v + 1;
      first_v = second_v;
      second_v = third_v;
      third_v = t;
    } else {
      h_new_vec[i + 1]->setNeighbors(h_new_twin_vec[i],
                                     h_new_twin_vec[i + 1],
                                     v_outer_vec[third_v],
                                     e_new_vec[i + 1],
                                     f_new_vec[i]);
      h_new_twin_vec[i]->setNeighbors(h_outer_vec[first_v],
                                      h_new_vec[i],
                                      v_outer_vec[second_v],
                                      e_new_vec[i],
                                      f_new_vec[i]);
      h_outer_vec[first_v]->next() = h_new_vec[i + 1];
      h_outer_vec[first_v]->face() = f_new_vec[i];
      t = second_v - 1;
      first_v = second_v;
      second_v = third_v;
      third_v = t;
    }
  }

  // Halfedges of the final faces
  if (degree % 2 == 0) {
    h_new_twin_vec.back()->setNeighbors(h_outer_vec[second_v],
                                        h_new_vec.back(),
                                        v_outer_vec[first_v],
                                        e_new_vec.back(),
                                        f_new_vec.back());
    h_outer_vec[second_v]->face() = f_new_vec.back();
    h_outer_vec[third_v]->face() = f_new_vec.back();
    h_outer_vec[third_v]->next() = h_new_twin_vec.back();
  } else {
    h_new_twin_vec.back()->setNeighbors(h_outer_vec[first_v],
                                        h_new_vec.back(),
                                        v_outer_vec[second_v],
                                        e_new_vec.back(),
                                        f_new_vec.back());
    h_outer_vec[first_v]->face() = f_new_vec.back();
    h_outer_vec[third_v]->face() = f_new_vec.back();
    h_outer_vec[third_v]->next() = h_new_twin_vec.back();
  }
}